

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::generate_parents
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *section,string *name,char parentSeparator)

{
  pointer pbVar1;
  pointer pcVar2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *args;
  undefined8 uVar3;
  int iVar4;
  long lVar5;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plist;
  undefined1 local_f8 [17];
  undefined7 uStack_e7;
  size_type sStack_e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d8;
  pointer local_d0;
  pointer local_c8;
  undefined1 local_c0 [24];
  string local_a8;
  undefined1 local_88 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (section->_M_dataplus)._M_p;
  local_d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  local_d0 = (pointer)local_c0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + section->_M_string_length);
  local_c0._16_8_ = name;
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_d0,(undefined1 *)((long)&(local_c8->_M_dataplus)._M_p + (long)local_d0),local_d0)
  ;
  pbVar1 = (pointer)(local_f8 + 0x10);
  if (local_d0 == (pointer)local_c0) {
    sStack_e0 = local_c0._8_8_;
    local_f8._0_8_ = pbVar1;
  }
  else {
    local_f8._0_8_ = local_d0;
  }
  stack0xffffffffffffff18 = (pointer)CONCAT71(local_c0._1_7_,local_c0[0]);
  local_f8._8_8_ = local_c8;
  local_c8 = (pointer)0x0;
  local_c0[0] = 0;
  local_d0 = (pointer)local_c0;
  iVar4 = ::std::__cxx11::string::compare(local_f8);
  if ((pointer)local_f8._0_8_ != pbVar1) {
    operator_delete((void *)local_f8._0_8_);
  }
  args = local_d8;
  if (local_d0 != (pointer)local_c0) {
    operator_delete(local_d0);
  }
  if (iVar4 != 0) {
    lVar5 = ::std::__cxx11::string::find((char)section,(ulong)(uint)(int)parentSeparator);
    if (lVar5 == -1) {
      pcVar2 = (section->_M_dataplus)._M_p;
      local_f8._0_8_ = pbVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_f8,pcVar2,pcVar2 + section->_M_string_length);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<std::__cxx11::string_const*>(args,local_f8,&local_d8);
      pbVar6 = (pointer)local_f8._0_8_;
      if ((pointer)local_f8._0_8_ == pbVar1) goto LAB_0013f912;
    }
    else {
      pcVar2 = (section->_M_dataplus)._M_p;
      local_88._0_8_ = (pointer)(local_88 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,pcVar2,pcVar2 + section->_M_string_length);
      split_up(&local_48,(string *)local_88,parentSeparator);
      local_f8._0_8_ = *(undefined8 *)args;
      local_f8._8_8_ = *(undefined8 *)(args + 8);
      unique0x00012000 = *(pointer *)(args + 0x10);
      *(pointer *)args =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)(args + 8) =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)(args + 0x10) =
           local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_f8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      pbVar6 = (pointer)local_88._0_8_;
      if ((pointer)local_88._0_8_ == (pointer)(local_88 + 0x10)) goto LAB_0013f912;
    }
    operator_delete(pbVar6);
  }
LAB_0013f912:
  uVar3 = local_c0._16_8_;
  lVar5 = ::std::__cxx11::string::find((char)local_c0._16_8_,(ulong)(uint)(int)parentSeparator);
  if (lVar5 != -1) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_c0 + 0x18),*(long *)uVar3,*(long *)uVar3 + *(size_type *)(uVar3 + 8)
              );
    split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_f8,(string *)(local_c0 + 0x18),parentSeparator);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    ::std::__cxx11::string::_M_assign((string *)uVar3);
    pbVar1 = (pointer)(local_f8._8_8_ + -0x20);
    pcVar2 = (((pointer)(local_f8._8_8_ + -0x20))->_M_dataplus)._M_p;
    pbVar6 = (pointer)(local_f8._8_8_ + -0x20);
    local_f8._8_8_ = pbVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &pbVar6->field_2) {
      operator_delete(pcVar2);
    }
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (args,*(undefined8 *)(args + 8),local_f8._0_8_,local_f8._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f8);
  }
  remove_quotes((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)args);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)args;
}

Assistant:

CLI11_INLINE std::vector<std::string>
generate_parents(const std::string &section, std::string &name, char parentSeparator) {
    std::vector<std::string> parents;
    if(detail::to_lower(section) != "default") {
        if(section.find(parentSeparator) != std::string::npos) {
            parents = detail::split_up(section, parentSeparator);
        } else {
            parents = {section};
        }
    }
    if(name.find(parentSeparator) != std::string::npos) {
        std::vector<std::string> plist = detail::split_up(name, parentSeparator);
        name = plist.back();
        plist.pop_back();
        parents.insert(parents.end(), plist.begin(), plist.end());
    }
    // clean up quotes on the parents
    try {
        detail::remove_quotes(parents);
    } catch(const std::invalid_argument &iarg) {
        throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
    }
    return parents;
}